

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.c
# Opt level: O1

void test_ack_decode(void)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint8_t **ppuVar6;
  uint8_t **end;
  uint64_t uVar7;
  uint8_t pat [4];
  uint8_t *src;
  quicly_ack_frame_t decoded;
  undefined8 local_1460;
  undefined1 local_1458 [8];
  uint8_t *local_1450 [127];
  quicly_ack_frame_t local_1058;
  
  local_1458 = (undefined1  [8])&local_1460;
  local_1460 = (uint8_t **)CONCAT44(local_1460._4_4_,0x11000034);
  iVar3 = quicly_decode_ack_frame
                    ((uint8_t **)local_1458,(uint8_t *)((long)&local_1460 + 4),&local_1058,0);
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x45)
  ;
  _ok((uint)(local_1458 == (undefined1  [8])((long)&local_1460 + 4)),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x46)
  ;
  _ok((uint)(local_1058.largest_acknowledged == 0x34),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x47)
  ;
  _ok((uint)(local_1058.num_gaps == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x48)
  ;
  _ok((uint)(local_1058.ack_block_lengths[0] == 0x12),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x49)
  ;
  _ok((uint)(local_1058.smallest_acknowledged == 0x23),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c");
  local_1458 = (undefined1  [8])0x403020100020034;
  local_1460 = (uint8_t **)local_1458;
  iVar3 = quicly_decode_ack_frame((uint8_t **)&local_1460,(uint8_t *)local_1450,&local_1058,0);
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x50)
  ;
  _ok((uint)(local_1460 == local_1450),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x51)
  ;
  _ok((uint)(local_1058.largest_acknowledged == 0x34),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x52)
  ;
  _ok((uint)(local_1058.num_gaps == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x53)
  ;
  _ok((uint)(local_1058.ack_block_lengths[0] == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x54)
  ;
  _ok((uint)(local_1058.gaps[0] == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x55)
  ;
  _ok((uint)(local_1058.ack_block_lengths[1] == 3),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x56)
  ;
  _ok((uint)(local_1058.gaps[1] == 4),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x57)
  ;
  _ok((uint)(local_1058.ack_block_lengths[2] == 5),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x58)
  ;
  _ok((uint)(local_1058.smallest_acknowledged == 0x26),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x59)
  ;
  local_1458[0] = 0x80;
  lVar4 = 0x10;
  end = (uint8_t **)(local_1458 + 6);
  do {
    ppuVar6 = end;
    *(char *)((long)ppuVar6 + -5) = (char)(64000L >> ((byte)lVar4 & 0x3f));
    end = (uint8_t **)((long)ppuVar6 + 1);
    lVar4 = lVar4 + -8;
  } while (lVar4 != 0);
  *(undefined4 *)((long)ppuVar6 + -4) = 0x1e410000;
  *(undefined1 *)ppuVar6 = 8;
  uVar5 = 0;
  do {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5;
    if (0x3f < uVar5) {
      *(byte *)end = (byte)(uVar5 >> 8) | 0x40;
      end = (uint8_t **)((long)end + 1);
    }
    *(char *)end = (char)uVar5;
    *(byte *)((long)end + 1) =
         ((byte)(SUB164(auVar2 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5 + (char)uVar5;
    end = (uint8_t **)((long)end + 2);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x11e);
  local_1460 = (uint8_t **)local_1458;
  iVar3 = quicly_decode_ack_frame((uint8_t **)&local_1460,(uint8_t *)end,&local_1058,0);
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6a)
  ;
  _ok((uint)(local_1058.largest_acknowledged == 64000),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6b)
  ;
  _ok((uint)(local_1058.ack_delay == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6c)
  ;
  _ok((uint)(local_1058.num_gaps == 0x100),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6d)
  ;
  _ok((uint)(local_1058.ack_block_lengths[0] == 9),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6e)
  ;
  uVar7 = local_1058.ack_block_lengths[0];
  if (local_1058.num_gaps != 0) {
    lVar4 = 1;
    uVar5 = 0;
    do {
      uVar1 = uVar5 + 1;
      _ok((uint)(uVar1 == local_1058.gaps[uVar5]),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",
          0x71);
      _ok((uint)(lVar4 + (uVar5 / 5 & 0xfffffffffffffffe) * -5 ==
                local_1058.ack_block_lengths[uVar5 + 1]),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",
          0x72);
      uVar7 = uVar7 + local_1058.gaps[uVar5] + local_1058.ack_block_lengths[uVar5 + 1];
      lVar4 = lVar4 + 1;
      uVar5 = uVar1;
    } while (uVar1 < local_1058.num_gaps);
  }
  _ok((uint)(local_1460 == end),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x75)
  ;
  _ok((uint)(local_1058.smallest_acknowledged == 0xfa01 - uVar7),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x76)
  ;
  subtest("underflow",test_ack_decode_underflow);
  return;
}

Assistant:

static void test_ack_decode(void)
{
    {
        const uint8_t pat[] = {0x34, 0x00, 0x00, 0x11}, *src = pat;
        quicly_ack_frame_t decoded;
        ok(quicly_decode_ack_frame(&src, pat + sizeof(pat), &decoded, 0) == 0);
        ok(src == pat + sizeof(pat));
        ok(decoded.largest_acknowledged == 0x34);
        ok(decoded.num_gaps == 0);
        ok(decoded.ack_block_lengths[0] == 0x12);
        ok(decoded.smallest_acknowledged == 0x34 - 0x12 + 1);
    }

    {
        const uint8_t pat[] = {0x34, 0x00, 0x02, 0x00, 0x01, 0x02, 0x03, 0x04}, *src = pat;
        quicly_ack_frame_t decoded;
        ok(quicly_decode_ack_frame(&src, pat + sizeof(pat), &decoded, 0) == 0);
        ok(src == pat + sizeof(pat));
        ok(decoded.largest_acknowledged == 0x34);
        ok(decoded.num_gaps == 2);
        ok(decoded.ack_block_lengths[0] == 1);
        ok(decoded.gaps[0] == 2);
        ok(decoded.ack_block_lengths[1] == 3);
        ok(decoded.gaps[1] == 4);
        ok(decoded.ack_block_lengths[2] == 5);
        ok(decoded.smallest_acknowledged == 0x34 - 1 - 2 - 3 - 4 - 5 + 1);
    }

    { /* Bogus ACK Frame larger than the internal buffer */
        uint8_t pat[1024], *end = pat;
        const uint8_t *src = pat;
        uint64_t i, range_sum;
        quicly_ack_frame_t decoded;
        end = quicly_encodev(end, 0xFA00);
        end = quicly_encodev(end, 0);
        end = quicly_encodev(end, QUICLY_ACK_MAX_GAPS + 30); // with excess ranges
        end = quicly_encodev(end, 8);
        for (i = 0; i < QUICLY_ACK_MAX_GAPS + 30; ++i) {
            end = quicly_encodev(end, i);      // gap
            end = quicly_encodev(end, i % 10); // ack-range
        }

        ok(quicly_decode_ack_frame(&src, end, &decoded, 0) == 0);
        ok(decoded.largest_acknowledged == 0xFA00);
        ok(decoded.ack_delay == 0);
        ok(decoded.num_gaps == QUICLY_ACK_MAX_GAPS);
        ok(decoded.ack_block_lengths[0] == 8 + 1); // first ack-range
        range_sum = decoded.ack_block_lengths[0];
        for (i = 0; i < decoded.num_gaps; ++i) {
            ok(decoded.gaps[i] == i + 1);
            ok(decoded.ack_block_lengths[i + 1] == (i % 10) + 1);
            range_sum += decoded.gaps[i] + decoded.ack_block_lengths[i + 1];
        }
        ok(src == end); // decoded the entire frame
        ok(decoded.smallest_acknowledged == 0xFA00 - range_sum + 1);
    }

    subtest("underflow", test_ack_decode_underflow);
}